

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ParseSimpleFile
               (string_view path,LineConsumer *line_consumer,string *out_error)

{
  bool bVar1;
  int file_descriptor;
  int *piVar2;
  char *pcVar3;
  ZeroCopyInputStream *input_stream;
  AlphaNum *in_R9;
  string_view stream_name;
  FileInputStream file_stream;
  undefined1 local_138 [20];
  bool bStack_124;
  undefined3 uStack_123;
  CopyingInputStreamAdaptor local_118;
  string local_e0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  pcVar3 = path._M_str;
  input_stream = (ZeroCopyInputStream *)path._M_len;
  while( true ) {
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,pcVar3,pcVar3 + (long)input_stream);
    file_descriptor = open((char *)local_138._0_8_,0);
    if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
      operator_delete((void *)local_138._0_8_,CONCAT44(_bStack_124,local_138._16_4_) + 1);
    }
    if (-1 < file_descriptor) break;
    piVar2 = __errno_location();
    if (*piVar2 != 4) {
      local_138._0_8_ = (_func_int **)0x17;
      local_138._8_8_ = "error: Unable to open \"";
      local_c0.piece_._M_len = 3;
      local_c0.piece_._M_str = "\", ";
      local_90.piece_._M_len = (size_t)input_stream;
      local_90.piece_._M_str = pcVar3;
      local_60.piece_._M_str = strerror(*piVar2);
      if (local_60.piece_._M_str == (char *)0x0) {
        local_60.piece_._M_len = 0;
      }
      else {
        local_60.piece_._M_len = strlen(local_60.piece_._M_str);
      }
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_e0,(lts_20250127 *)local_138,&local_90,&local_c0,&local_60,in_R9);
      std::__cxx11::string::operator=((string *)out_error,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  io::FileInputStream::FileInputStream((FileInputStream *)local_138,file_descriptor,-1);
  bStack_124 = true;
  stream_name._M_str = (char *)line_consumer;
  stream_name._M_len = (size_t)pcVar3;
  bVar1 = ParseSimpleStream((objectivec *)local_138,input_stream,stream_name,
                            (LineConsumer *)out_error,(string *)in_R9);
  io::CopyingInputStreamAdaptor::~CopyingInputStreamAdaptor(&local_118);
  io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream
            ((CopyingFileInputStream *)(local_138 + 8));
  return bVar1;
}

Assistant:

bool ParseSimpleFile(absl::string_view path, LineConsumer* line_consumer,
                     std::string* out_error) {
  int fd;
  do {
    fd = posix::open(std::string(path).c_str(), O_RDONLY);
  } while (fd < 0 && errno == EINTR);
  if (fd < 0) {
    *out_error =
        absl::StrCat("error: Unable to open \"", path, "\", ", strerror(errno));
    return false;
  }
  io::FileInputStream file_stream(fd);
  file_stream.SetCloseOnDelete(true);

  return ParseSimpleStream(file_stream, path, line_consumer, out_error);
}